

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tattle_global(REF_NODE ref_node,REF_INT global)

{
  uint uVar1;
  long local_50;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_status;
  REF_INT node;
  REF_BOOL found_from_exhaustive;
  REF_BOOL found_from_sorted;
  REF_INT local_from_exhaustive;
  REF_INT local_from_sorted;
  REF_INT global_local;
  REF_NODE ref_node_local;
  
  local_from_exhaustive = global;
  _local_from_sorted = ref_node;
  uVar1 = ::ref_node_local(ref_node,(long)global,&found_from_sorted);
  if (uVar1 == 5) {
    node = 0;
  }
  else {
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x106,
             "ref_node_tattle_global",(ulong)uVar1,"local search");
      return uVar1;
    }
    node = 1;
  }
  ref_status = 0;
  found_from_exhaustive = -1;
  ref_private_macro_code_rss = 0;
  do {
    if (_local_from_sorted->max <= ref_private_macro_code_rss) {
      printf("%d: global %d: search%d %d exhaust%d %d\n",
             (ulong)(uint)_local_from_sorted->ref_mpi->id,(ulong)(uint)local_from_exhaustive,
             (ulong)(uint)node,(ulong)(uint)found_from_sorted,(ulong)(uint)ref_status,
             found_from_exhaustive);
      return 0;
    }
    if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < _local_from_sorted->max)
        ) && (-1 < _local_from_sorted->global[ref_private_macro_code_rss])) {
      if (((ref_private_macro_code_rss < 0) ||
          (_local_from_sorted->max <= ref_private_macro_code_rss)) ||
         (_local_from_sorted->global[ref_private_macro_code_rss] < 0)) {
        local_50 = -1;
      }
      else {
        local_50 = _local_from_sorted->global[ref_private_macro_code_rss];
      }
      if (local_from_exhaustive == local_50) {
        if (ref_status != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x10e,"ref_node_tattle_global",1,"twice");
          return 1;
        }
        found_from_exhaustive = ref_private_macro_code_rss;
        ref_status = 1;
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_node_tattle_global(REF_NODE ref_node, REF_INT global) {
  REF_INT local_from_sorted;
  REF_INT local_from_exhaustive;
  REF_BOOL found_from_sorted;
  REF_BOOL found_from_exhaustive;
  REF_INT node;

  REF_STATUS ref_status;

  ref_status = ref_node_local(ref_node, global, &local_from_sorted);
  if (REF_NOT_FOUND == ref_status) {
    found_from_sorted = REF_FALSE;
  } else {
    RSS(ref_status, "local search");
    found_from_sorted = REF_TRUE;
  }

  found_from_exhaustive = REF_FALSE;
  local_from_exhaustive = REF_EMPTY;
  each_ref_node_valid_node(ref_node, node) {
    if (global == ref_node_global(ref_node, node)) {
      if (found_from_exhaustive) RSS(REF_FAILURE, "twice");
      local_from_exhaustive = node;
      found_from_exhaustive = REF_TRUE;
    }
  }

  printf("%d: global %d: search%d %d exhaust%d %d\n",
         ref_mpi_rank(ref_node_mpi(ref_node)), global, found_from_sorted,
         local_from_sorted, found_from_exhaustive, local_from_exhaustive);

  return REF_SUCCESS;
}